

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

target_ulong helper_4xx_tlbre_lo_ppc64(CPUPPCState_conflict2 *env,target_ulong entry)

{
  ulong *puVar1;
  ulong local_28;
  target_ulong ret;
  ppcemb_tlb_t_conflict2 *tlb;
  target_ulong entry_local;
  CPUPPCState_conflict2 *env_local;
  
  puVar1 = (ulong *)((long)(env->tlb).tlb6 + (entry & 0x3f) * 0x28);
  local_28 = *puVar1;
  if ((puVar1[4] & 4) != 0) {
    local_28 = local_28 | 0x200;
  }
  if ((puVar1[4] & 2) != 0) {
    local_28 = local_28 | 0x100;
  }
  return local_28;
}

Assistant:

target_ulong helper_4xx_tlbre_lo(CPUPPCState *env, target_ulong entry)
{
    ppcemb_tlb_t *tlb;
    target_ulong ret;

    entry &= PPC4XX_TLB_ENTRY_MASK;
    tlb = &env->tlb.tlbe[entry];
    ret = tlb->RPN;
    if (tlb->prot & PAGE_EXEC) {
        ret |= PPC4XX_TLBLO_EX;
    }
    if (tlb->prot & PAGE_WRITE) {
        ret |= PPC4XX_TLBLO_WR;
    }
    return ret;
}